

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

bool vkt::anon_unknown_0::performBoolOp(BoolOp op,bool a,bool b)

{
  byte local_22;
  byte local_21;
  bool b_local;
  bool a_local;
  BoolOp op_local;
  
  switch(op) {
  case BOOLOP_AND:
    local_22 = 0;
    if (a) {
      local_22 = b;
    }
    a_local = (bool)(local_22 & 1);
    break;
  case BOOLOP_OR:
    local_21 = 1;
    if (!a) {
      local_21 = b;
    }
    a_local = (bool)(local_21 & 1);
    break;
  case BOOLOP_EQ:
    a_local = a == b;
    break;
  case BOOLOP_NEQ:
    a_local = a != b;
    break;
  default:
    a_local = false;
  }
  return a_local;
}

Assistant:

bool performBoolOp (BoolOp op, bool a, bool b)
{
	switch (op)
	{
		case BOOLOP_OR:
			return a || b;

		case BOOLOP_AND:
			return a && b;

		case BOOLOP_EQ:
			return a == b;

		case BOOLOP_NEQ:
			return a != b;

		default:
			DE_FATAL("Unknown boolean operation.");
			return false;
	}
}